

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O2

void Qiniu_Rio_SetSettings(Qiniu_Rio_Settings *v)

{
  undefined8 uVar1;
  Qiniu_Rio_ThreadModel QVar2;
  
  uVar1._0_4_ = v->taskQsize;
  uVar1._4_4_ = v->workers;
  settings.chunkSize = v->chunkSize;
  settings.tryTimes = v->tryTimes;
  settings.threadModel = v->threadModel;
  QVar2 = settings.threadModel;
  settings._0_8_ = uVar1;
  if (uVar1._4_4_ == 0) {
    settings.workers = 4;
    settings.taskQsize = (int)uVar1;
    uVar1._4_4_ = 4;
  }
  if (settings.taskQsize == 0) {
    settings.taskQsize = uVar1._4_4_ << 2;
  }
  if (settings.chunkSize == 0) {
    settings.chunkSize = 0x400000;
  }
  if (settings.tryTimes == 0) {
    settings.tryTimes = 3;
  }
  settings.threadModel.itbl = (v->threadModel).itbl;
  if (settings.threadModel.itbl != (Qiniu_Rio_ThreadModel_Itbl *)0x0) {
    settings.threadModel = QVar2;
    return;
  }
  settings.threadModel = Qiniu_Rio_ST;
  return;
}

Assistant:

void Qiniu_Rio_SetSettings(Qiniu_Rio_Settings *v)
{
    settings = *v;
    if (settings.workers == 0)
    {
        settings.workers = defaultWorkers;
    }
    if (settings.taskQsize == 0)
    {
        settings.taskQsize = settings.workers * 4;
    }
    if (settings.chunkSize == 0)
    {
        settings.chunkSize = defaultChunkSize;
    }
    if (settings.tryTimes == 0)
    {
        settings.tryTimes = defaultTryTimes;
    }
    if (settings.threadModel.itbl == NULL)
    {
        settings.threadModel = Qiniu_Rio_ST;
    }
}